

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessageData::InitializeEncodingAndFormat
          (LogMessageData *this)

{
  int iVar1;
  pointer pcVar2;
  char *tag;
  Span<char> *pSVar3;
  uint64_t value;
  undefined8 extraout_RDX;
  int32_t iVar4;
  Span<char> *in_R8;
  Span<const_char> value_00;
  Time t;
  
  pcVar2 = (pointer)(this->entry).full_filename_._M_len;
  tag = (this->entry).full_filename_._M_str;
  pSVar3 = encoded_remaining(this);
  value_00.len_ = (size_type)pSVar3;
  value_00.ptr_ = pcVar2;
  EncodeBytesTruncate((log_internal *)0x2,(uint64_t)tag,value_00,in_R8);
  iVar4 = (this->entry).line_;
  pSVar3 = encoded_remaining(this);
  EncodeVarint(3,iVar4,pSVar3);
  t.rep_.rep_hi_.hi_ = 0;
  t.rep_.rep_hi_.lo_ = (this->entry).timestamp_.rep_.rep_lo_;
  t.rep_.rep_lo_ = (uint32_t)extraout_RDX;
  value = ToUnixNanos((lts_20250127 *)(this->entry).timestamp_.rep_.rep_hi_,t);
  pSVar3 = encoded_remaining(this);
  EncodeVarint(4,value,pSVar3);
  switch((this->entry).severity_) {
  case kInfo:
    iVar1 = (this->entry).verbose_level_;
    iVar4 = 800;
    if (iVar1 != -1) {
      iVar4 = 600 - iVar1;
    }
    break;
  case kWarning:
    iVar4 = 900;
    break;
  case kError:
    iVar4 = 0x3b6;
    break;
  case kFatal:
    iVar4 = 0x44c;
    break;
  default:
    iVar4 = 800;
  }
  pSVar3 = encoded_remaining(this);
  EncodeVarint(5,iVar4,pSVar3);
  iVar4 = (this->entry).tid_;
  pSVar3 = encoded_remaining(this);
  EncodeVarint(6,iVar4,pSVar3);
  return;
}

Assistant:

void LogMessage::LogMessageData::InitializeEncodingAndFormat() {
  EncodeStringTruncate(EventTag::kFileName, entry.source_filename(),
                       &encoded_remaining());
  EncodeVarint(EventTag::kFileLine, entry.source_line(), &encoded_remaining());
  EncodeVarint(EventTag::kTimeNsecs, absl::ToUnixNanos(entry.timestamp()),
               &encoded_remaining());
  EncodeVarint(EventTag::kSeverity,
               ProtoSeverity(entry.log_severity(), entry.verbosity()),
               &encoded_remaining());
  EncodeVarint(EventTag::kThreadId, entry.tid(), &encoded_remaining());
}